

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamEuler::SetupInitial(ChElementBeamEuler *this,ChSystem *system)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  double dVar5;
  ulong uVar6;
  undefined8 uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  
  peVar1 = (this->section).
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x1bc,"virtual void chrono::fea::ChElementBeamEuler::SetupInitial(ChSystem *)");
  }
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar20 = (peVar4->X0).coord.pos.m_data[1] - (peVar3->X0).coord.pos.m_data[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = (peVar4->X0).coord.pos.m_data[0] - (peVar3->X0).coord.pos.m_data[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar20 * dVar20;
  auVar17 = vfmadd231sd_fma(auVar30,auVar39,auVar39);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (peVar4->X0).coord.pos.m_data[2] - (peVar3->X0).coord.pos.m_data[2];
  auVar17 = vfmadd231sd_fma(auVar17,auVar35,auVar35);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar51 = auVar17._0_8_;
  (this->super_ChElementBeam).length = dVar51;
  dVar20 = dVar51;
  (*(peVar1->super_ChBeamSection)._vptr_ChBeamSection[0xb])();
  auVar15 = ZEXT816(0) << 0x40;
  (this->super_ChElementBeam).mass = dVar20 * dVar51;
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar20 = (peVar3->X0).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] +
           (peVar4->X0).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar29 = (peVar4->X0).coord.pos.m_data[0] - (peVar3->X0).coord.pos.m_data[0];
  dVar51 = (peVar3->X0).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] +
           (peVar4->X0).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar39 = vsubpd_avx(*(undefined1 (*) [16])((peVar4->X0).coord.pos.m_data + 1),
                       *(undefined1 (*) [16])((peVar3->X0).coord.pos.m_data + 1));
  dVar5 = (peVar3->X0).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] +
          (peVar4->X0).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar20 * dVar20;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar5;
  auVar17 = vfmadd231sd_fma(auVar22,auVar37,auVar37);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar51;
  auVar17 = vfmadd231sd_fma(auVar17,auVar46,auVar46);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  auVar16 = ZEXT816(0x3ff0000000000000);
  dVar34 = auVar17._0_8_;
  dVar49 = 1.0 / dVar34;
  bVar12 = 2.2250738585072014e-308 <= dVar34;
  dVar5 = dVar49 * dVar5;
  dVar51 = dVar49 * dVar51;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar5;
  auVar17._0_8_ = (double)((ulong)bVar12 * (long)dVar5 + (ulong)!bVar12 * 0x3ff0000000000000);
  auVar17._8_8_ = 0;
  dVar5 = (double)((ulong)bVar12 * (long)(dVar49 * dVar20));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar51;
  dVar51 = (double)((ulong)bVar12 * (long)dVar51);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar51;
  if ((dVar29 != 0.0) || (NAN(dVar29))) {
LAB_0065e0d6:
    dVar28 = auVar39._0_8_;
    auVar39 = vshufpd_avx(auVar39,auVar39,1);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar28 * dVar28;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar29;
    auVar16 = vfmadd231sd_fma(auVar23,auVar42,auVar42);
    auVar16 = vfmadd231sd_fma(auVar16,auVar39,auVar39);
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    dVar56 = 1.0 / auVar16._0_8_;
    bVar12 = 2.2250738585072014e-308 <= auVar16._0_8_;
    dVar8 = (double)((ulong)bVar12 * (long)(auVar39._0_8_ * dVar56));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (ulong)bVar12 * (long)(dVar28 * dVar56);
    auVar16._0_8_ = (ulong)bVar12 * (long)(dVar56 * dVar29) + (ulong)!bVar12 * 0x3ff0000000000000;
    auVar16._8_8_ = 0;
  }
  else {
    uVar6 = vcmppd_avx512vl(auVar39,ZEXT816(0) << 0x40,0);
    if (((uVar6 & 1) == 0) || (dVar8 = 0.0, (uVar6 & 3) >> 1 == 0)) goto LAB_0065e0d6;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar8;
  dVar57 = auVar15._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar5 * dVar8;
  auVar39 = vfmsub231sd_fma(auVar54,auVar15,auVar14);
  dVar5 = auVar39._0_8_;
  dVar56 = auVar16._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar57 * auVar17._0_8_;
  auVar18 = vfmsub231sd_fma(auVar43,auVar16,auVar18);
  dVar29 = auVar18._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar51 * dVar56;
  auVar17 = vfmsub231sd_fma(auVar52,auVar13,auVar17);
  dVar51 = auVar17._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar51 * dVar51;
  auVar17 = vfmadd231sd_fma(auVar47,auVar39,auVar39);
  auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar28 = auVar17._0_8_;
  if (dVar28 < 0.0001) {
    if ((dVar34 < 2.2250738585072014e-308) ||
       (auVar9._8_8_ = 0x7fffffffffffffff, auVar9._0_8_ = 0x7fffffffffffffff,
       auVar17 = vandpd_avx512vl(auVar40,auVar9), 0.9 <= auVar17._0_8_)) {
      auVar17 = ZEXT816(0x3ff0000000000000);
      auVar19 = ZEXT816(0);
      if (dVar34 < 2.2250738585072014e-308) {
        auVar39 = ZEXT816(0);
      }
      else {
        auVar10._8_8_ = 0x7fffffffffffffff;
        auVar10._0_8_ = 0x7fffffffffffffff;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar49 * dVar20;
        auVar18 = vandpd_avx512vl(auVar38,auVar10);
        auVar39 = SUB6416(ZEXT864(0),0) << 0x40;
        if (0.9 <= auVar18._0_8_) {
          auVar11._8_8_ = 0x7fffffffffffffff;
          auVar11._0_8_ = 0x7fffffffffffffff;
          auVar18 = vandpd_avx512vl(auVar31,auVar11);
          auVar17 = ZEXT816(0);
          uVar7 = vcmpsd_avx512f(auVar18,ZEXT816(0x3feccccccccccccd),5);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = (ulong)!(bool)((byte)uVar7 & 1) * 0x3ff0000000000000;
        }
      }
    }
    else {
      auVar39 = ZEXT816(0x3ff0000000000000);
      auVar19 = ZEXT816(0);
      auVar17 = ZEXT816(0) << 0x40;
    }
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auVar19._0_8_ * -dVar56;
    auVar18 = vfmadd231sd_fma(auVar53,auVar13,auVar39);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = -dVar8 * auVar17._0_8_;
    auVar14 = vfmadd231sd_fma(auVar55,auVar15,auVar19);
    dVar5 = auVar14._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar39._0_8_ * -dVar57;
    auVar17 = vfmadd231sd_fma(auVar44,auVar16,auVar17);
    dVar29 = auVar17._0_8_;
    dVar51 = auVar18._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar51 * dVar51;
    auVar39 = vfmadd231sd_fma(auVar32,auVar14,auVar14);
    auVar17 = vfmadd231sd_fma(auVar39,auVar17,auVar17);
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    dVar28 = auVar17._0_8_;
  }
  dVar28 = 1.0 / dVar28;
  dVar5 = dVar5 * dVar28;
  dVar51 = dVar51 * dVar28;
  dVar29 = dVar29 * dVar28;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar29;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar8 * dVar5;
  auVar17 = vfmsub231sd_fma(auVar36,auVar33,auVar16);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar57 * dVar29;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar51;
  auVar39 = vfmsub231sd_fma(auVar45,auVar48,auVar13);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar5;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar56 * dVar51;
  auVar16 = vfmsub231sd_fma(auVar50,auVar41,auVar15);
  dVar34 = auVar17._0_8_;
  dVar20 = dVar29 + dVar56 + dVar34;
  dVar49 = auVar39._0_8_;
  dVar28 = auVar16._0_8_;
  if (0.0 <= dVar20) {
    dVar20 = dVar20 + 1.0;
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar20;
      auVar17 = vsqrtsd_avx(auVar25,auVar25);
      dVar20 = auVar17._0_8_;
    }
    dVar56 = dVar20 * 0.5;
    dVar20 = 0.5 / dVar20;
    dVar29 = (dVar28 - dVar51) * dVar20;
    dVar34 = (dVar5 - dVar8) * dVar20;
    dVar20 = (dVar57 - dVar49) * dVar20;
    goto LAB_0065e4ec;
  }
  if (dVar34 <= dVar56) {
    if (dVar56 < dVar29) goto LAB_0065e2cc;
    dVar20 = ((dVar56 - dVar34) - dVar29) + 1.0;
    if (dVar20 < 0.0) {
      dVar21 = sqrt(dVar20);
    }
    else {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar20;
      auVar17 = vsqrtsd_avx(auVar27,auVar27);
      dVar21 = auVar17._0_8_;
    }
    dVar56 = dVar28 - dVar51;
    dVar29 = dVar21 * 0.5;
    dVar21 = 0.5 / dVar21;
    dVar34 = (dVar57 + dVar49) * dVar21;
    dVar20 = (dVar8 + dVar5) * dVar21;
  }
  else if (dVar34 < dVar29) {
LAB_0065e2cc:
    dVar20 = ((dVar29 - dVar56) - dVar34) + 1.0;
    if (dVar20 < 0.0) {
      dVar21 = sqrt(dVar20);
    }
    else {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar20;
      auVar17 = vsqrtsd_avx(auVar26,auVar26);
      dVar21 = auVar17._0_8_;
    }
    dVar56 = dVar57 - dVar49;
    dVar20 = dVar21 * 0.5;
    dVar21 = 0.5 / dVar21;
    dVar29 = (dVar8 + dVar5) * dVar21;
    dVar34 = (dVar28 + dVar51) * dVar21;
  }
  else {
    dVar20 = ((dVar34 - dVar29) - dVar56) + 1.0;
    if (dVar20 < 0.0) {
      dVar21 = sqrt(dVar20);
    }
    else {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar20;
      auVar17 = vsqrtsd_avx(auVar24,auVar24);
      dVar21 = auVar17._0_8_;
    }
    dVar56 = dVar5 - dVar8;
    dVar34 = dVar21 * 0.5;
    dVar21 = 0.5 / dVar21;
    dVar20 = (dVar28 + dVar51) * dVar21;
    dVar29 = (dVar57 + dVar49) * dVar21;
  }
  dVar56 = dVar56 * dVar21;
LAB_0065e4ec:
  (this->q_element_ref_rot).m_data[0] = dVar56;
  (this->q_element_ref_rot).m_data[1] = dVar29;
  (this->q_element_ref_rot).m_data[2] = dVar34;
  (this->q_element_ref_rot).m_data[3] = dVar20;
  ComputeStiffnessMatrix(this);
  ComputeGeometricStiffnessMatrix(this);
  return;
}

Assistant:

void ChElementBeamEuler::SetupInitial(ChSystem* system) {
    assert(section);

    // Compute rest length, mass:
    this->length = (nodes[1]->GetX0().GetPos() - nodes[0]->GetX0().GetPos()).Length();
    this->mass = this->length * this->section->GetMassPerUnitLength();

    // Compute initial rotation
    ChMatrix33<> A0;
    ChVector<> mXele = nodes[1]->GetX0().GetPos() - nodes[0]->GetX0().GetPos();
    ChVector<> myele =
        (nodes[0]->GetX0().GetA().Get_A_Yaxis() + nodes[1]->GetX0().GetA().Get_A_Yaxis()).GetNormalized();
    A0.Set_A_Xdir(mXele, myele);
    q_element_ref_rot = A0.Get_A_quaternion();

    // Compute local stiffness matrix:
    ComputeStiffnessMatrix();

    // Compute local geometric stiffness matrix normalized by pull force P: Kg/P
    ComputeGeometricStiffnessMatrix();
}